

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConfigLiblistSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigLiblistSyntax,slang::syntax::ConfigLiblistSyntax_const&>
          (BumpAllocator *this,ConfigLiblistSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ConfigLiblistSyntax *pCVar8;
  
  pCVar8 = (ConfigLiblistSyntax *)allocate(this,0x60,8);
  (pCVar8->super_ConfigRuleClauseSyntax).super_SyntaxNode.previewNode =
       (args->super_ConfigRuleClauseSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_ConfigRuleClauseSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConfigRuleClauseSyntax).super_SyntaxNode.parent;
  (pCVar8->super_ConfigRuleClauseSyntax).super_SyntaxNode.kind =
       (args->super_ConfigRuleClauseSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar8->super_ConfigRuleClauseSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pCVar8->super_ConfigRuleClauseSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = (args->liblist).field_0x2;
  NVar6.raw = (args->liblist).numFlags.raw;
  uVar7 = (args->liblist).rawLen;
  pIVar2 = (args->liblist).info;
  (pCVar8->liblist).kind = (args->liblist).kind;
  (pCVar8->liblist).field_0x2 = uVar5;
  (pCVar8->liblist).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar8->liblist).rawLen = uVar7;
  (pCVar8->liblist).info = pIVar2;
  uVar4 = *(undefined4 *)&(args->libraries).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->libraries).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar8->libraries).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->libraries).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar8->libraries).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pCVar8->libraries).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar8->libraries).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->libraries).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar8->libraries).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005a2c10;
  (pCVar8->libraries).super_SyntaxListBase.childCount =
       (args->libraries).super_SyntaxListBase.childCount;
  sVar3 = (args->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar8->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  (pCVar8->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pCVar8->libraries).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005a3160;
  return pCVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }